

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O0

void __thiscall
kj::FunctionParam<void_()>::
Wrapper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1835:27)>
::operator()(Wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1835:27)>
             *this)

{
  Wrapper<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1835:27)>
  *this_local;
  
  anon_unknown_0::TestCase1772::run::anon_class_24_3_74fd5ae7::operator()(this->func);
  return;
}

Assistant:

inline Return operator()(Params... params) override {
      return func(kj::fwd<Params>(params)...);
    }